

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

bool __thiscall
cmCTest::HandleTestModelArgument
          (cmCTest *this,char *ctestExec,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  bool bVar2;
  size_t sVar3;
  ostream *poVar4;
  bool bVar5;
  cmCTest *this_00;
  string *s;
  char *local_1e8 [4];
  string arg;
  ostringstream cmCTestLog_msg;
  
  this_00 = (cmCTest *)&arg;
  std::__cxx11::string::string
            ((string *)&arg,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + *i));
  bVar2 = CheckArgument(this_00,&arg,"-M","--test-model");
  bVar5 = true;
  if (bVar2) {
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (*i < ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 1U) {
      sVar3 = *i + 1;
      *i = sVar3;
      s = pbVar1 + sVar3;
      cmsys::SystemTools::LowerCase((string *)&cmCTestLog_msg,s);
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &cmCTestLog_msg,"nightly");
      std::__cxx11::string::~string((string *)&cmCTestLog_msg);
      if (bVar2) {
        this->InteractiveDebugMode = false;
        this->TestModel = 1;
      }
      else {
        cmsys::SystemTools::LowerCase((string *)&cmCTestLog_msg,s);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&cmCTestLog_msg,"continuous");
        std::__cxx11::string::~string((string *)&cmCTestLog_msg);
        if (bVar2) {
          this->InteractiveDebugMode = false;
          this->TestModel = 2;
        }
        else {
          cmsys::SystemTools::LowerCase((string *)&cmCTestLog_msg,s);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&cmCTestLog_msg,"experimental");
          std::__cxx11::string::~string((string *)&cmCTestLog_msg);
          if (bVar2) {
            this->InteractiveDebugMode = false;
            this->TestModel = 0;
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
            poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,
                                     "CTest -M called with incorrect option: ");
            poVar4 = std::operator<<(poVar4,(string *)s);
            std::endl<char,std::char_traits<char>>(poVar4);
            std::__cxx11::stringbuf::str();
            Log(this,6,
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
                ,0x88c,local_1e8[0],false);
            std::__cxx11::string::~string((string *)local_1e8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
            poVar4 = std::operator<<((ostream *)&cmCTestLog_msg,"Available options are:");
            poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
            poVar4 = std::operator<<(poVar4,"  ");
            poVar4 = std::operator<<(poVar4,ctestExec);
            poVar4 = std::operator<<(poVar4," -M Continuous");
            poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
            poVar4 = std::operator<<(poVar4,"  ");
            poVar4 = std::operator<<(poVar4,ctestExec);
            poVar4 = std::operator<<(poVar4," -M Experimental");
            poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
            poVar4 = std::operator<<(poVar4,"  ");
            poVar4 = std::operator<<(poVar4,ctestExec);
            poVar4 = std::operator<<(poVar4," -M Nightly");
            std::endl<char,std::char_traits<char>>(poVar4);
            std::__cxx11::stringbuf::str();
            Log(this,6,
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
                ,0x891,local_1e8[0],false);
            std::__cxx11::string::~string((string *)local_1e8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
            bVar5 = false;
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&arg);
  return bVar5;
}

Assistant:

bool cmCTest::HandleTestModelArgument(const char* ctestExec, size_t& i,
                                      const std::vector<std::string>& args)
{
  bool success = true;
  std::string arg = args[i];
  if (this->CheckArgument(arg, "-M", "--test-model") &&
      (i < args.size() - 1)) {
    i++;
    std::string const& str = args[i];
    if (cmSystemTools::LowerCase(str) == "nightly") {
      this->SetTestModel(cmCTest::NIGHTLY);
    } else if (cmSystemTools::LowerCase(str) == "continuous") {
      this->SetTestModel(cmCTest::CONTINUOUS);
    } else if (cmSystemTools::LowerCase(str) == "experimental") {
      this->SetTestModel(cmCTest::EXPERIMENTAL);
    } else {
      success = false;
      cmCTestLog(this, ERROR_MESSAGE, "CTest -M called with incorrect option: "
                   << str << std::endl);
      cmCTestLog(this, ERROR_MESSAGE, "Available options are:"
                   << std::endl
                   << "  " << ctestExec << " -M Continuous" << std::endl
                   << "  " << ctestExec << " -M Experimental" << std::endl
                   << "  " << ctestExec << " -M Nightly" << std::endl);
    }
  }
  return success;
}